

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O2

UObject * __thiscall
icu_63::ICUService::getKey
          (ICUService *this,ICUServiceKey *key,UnicodeString *actualReturn,
          ICUServiceFactory *factory,UErrorCode *status)

{
  ushort uVar1;
  short sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int32_t iVar7;
  undefined4 extraout_var;
  ICUServiceFactory *pIVar8;
  Hashtable *this_00;
  long *plVar9;
  UObject *pUVar10;
  UnicodeString *pUVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ushort uVar12;
  undefined1 *size;
  UErrorCode *p;
  code *key_00;
  UObject *p_00;
  int iVar13;
  int index;
  UVector *local_b8;
  CacheEntry *local_b0;
  XMutex mutex;
  UnicodeString currentDescriptor;
  
  if (U_ZERO_ERROR < *status) {
    return (UObject *)0x0;
  }
  iVar6 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xc])();
  if ((char)iVar6 != '\0') {
    iVar6 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x11])(this,key,actualReturn,status);
    return (UObject *)CONCAT44(extraout_var,iVar6);
  }
  size = icu_63::lock;
  XMutex::XMutex(&mutex,(UMutex *)icu_63::lock,factory != (ICUServiceFactory *)0x0);
  if (this->serviceCache == (Hashtable *)0x0) {
    this_00 = (Hashtable *)UMemory::operator_new((UMemory *)0x58,(size_t)size);
    if (this_00 == (Hashtable *)0x0) {
      this->serviceCache = (Hashtable *)0x0;
    }
    else {
      p = status;
      Hashtable::Hashtable(this_00,status);
      this->serviceCache = this_00;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        Hashtable::setValueDeleter(this_00,cacheDeleter);
        goto LAB_0028c7fa;
      }
      Hashtable::~Hashtable(this_00);
      UMemory::operator_delete((UMemory *)this_00,p);
    }
    bVar3 = false;
    pUVar10 = (UObject *)0x0;
    goto LAB_0028cc3e;
  }
LAB_0028c7fa:
  currentDescriptor.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeString_003a7268;
  currentDescriptor.fUnion.fStackFields.fLengthAndFlags = 2;
  iVar6 = this->factories->count;
  if (factory == (ICUServiceFactory *)0x0) {
    index = 0;
  }
  else {
    index = 0;
    iVar13 = 0;
    if (0 < iVar6) {
      index = 0;
      iVar13 = iVar6;
    }
    do {
      if (iVar13 == index) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        bVar3 = true;
        pUVar10 = (UObject *)0x0;
        goto LAB_0028cc2d;
      }
      pIVar8 = (ICUServiceFactory *)UVector::elementAt(this->factories,index);
      index = index + 1;
    } while (pIVar8 != factory);
  }
  bVar5 = true;
  bVar3 = true;
  local_b8 = (UVector *)0x0;
  bVar4 = false;
  do {
    uVar1 = currentDescriptor.fUnion.fStackFields.fLengthAndFlags & 1;
    currentDescriptor.fUnion.fStackFields.fLengthAndFlags =
         currentDescriptor.fUnion.fStackFields.fLengthAndFlags & 0x1e;
    if (uVar1 != 0) {
      currentDescriptor.fUnion.fStackFields.fLengthAndFlags = 2;
    }
    (*(key->super_UObject)._vptr_UObject[6])(key,&currentDescriptor);
    key_00 = (code *)&currentDescriptor;
    local_b0 = (CacheEntry *)Hashtable::get(this->serviceCache,(UnicodeString *)key_00);
    iVar13 = index;
    if (local_b0 != (CacheEntry *)0x0) {
LAB_0028ca4c:
      if (!bVar4 || factory != (ICUServiceFactory *)0x0) goto LAB_0028ca61;
      Hashtable::put(this->serviceCache,&local_b0->actualDescriptor,local_b0,status);
      if (U_ZERO_ERROR < *status) goto LAB_0028cc18;
      if (local_b8 == (UVector *)0x0) goto LAB_0028ca61;
      iVar6 = local_b8->count;
      pUVar10 = (UObject *)0x0;
      goto LAB_0028cb0b;
    }
    while (iVar13 < iVar6) {
      plVar9 = (long *)UVector::elementAt(this->factories,iVar13);
      key_00 = (code *)key;
      pUVar10 = (UObject *)(**(code **)(*plVar9 + 0x18))(plVar9,key,this,status);
      if (U_ZERO_ERROR < *status) {
        bVar3 = bVar5;
        if (pUVar10 != (UObject *)0x0) {
          (*pUVar10->_vptr_UObject[1])(pUVar10);
        }
        goto LAB_0028cad4;
      }
      iVar13 = iVar13 + 1;
      if (pUVar10 != (UObject *)0x0) {
        local_b0 = (CacheEntry *)UMemory::operator_new((UMemory *)0x50,(size_t)key_00);
        if (local_b0 != (CacheEntry *)0x0) {
          bVar4 = true;
          CacheEntry::CacheEntry(local_b0,&currentDescriptor,pUVar10);
          goto LAB_0028ca4c;
        }
        (*pUVar10->_vptr_UObject[1])(pUVar10);
        *status = U_MEMORY_ALLOCATION_ERROR;
        bVar3 = bVar5;
        goto LAB_0028cad4;
      }
    }
    if (local_b8 == (UVector *)0x0) {
      local_b8 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)key_00);
      if (local_b8 != (UVector *)0x0) {
        key_00 = uprv_deleteUObject_63;
        UVector::UVector(local_b8,uprv_deleteUObject_63,(UElementsAreEqual *)0x0,5,status);
      }
      if (U_ZERO_ERROR < *status) goto LAB_0028cc18;
    }
    pUVar11 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)key_00);
    if ((pUVar11 == (UnicodeString *)0x0) ||
       (UnicodeString::UnicodeString(pUVar11,&currentDescriptor),
       (undefined1  [56])((undefined1  [56])pUVar11->fUnion & (undefined1  [56])0x1) !=
       (undefined1  [56])0x0)) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      bVar3 = bVar5;
      goto LAB_0028cad4;
    }
    UVector::addElement(local_b8,pUVar11,status);
    if (U_ZERO_ERROR < *status) goto LAB_0028cc18;
    iVar13 = (*(key->super_UObject)._vptr_UObject[7])();
    bVar4 = true;
  } while ((char)iVar13 != '\0');
  bVar3 = false;
LAB_0028cad4:
  pUVar10 = (UObject *)0x0;
LAB_0028cc1a:
  if (local_b8 != (UVector *)0x0) {
    (*(local_b8->super_UObject)._vptr_UObject[1])(local_b8);
  }
LAB_0028cc2d:
  UnicodeString::~UnicodeString(&currentDescriptor);
  bVar3 = !bVar3;
LAB_0028cc3e:
  XMutex::~XMutex(&mutex);
  if (bVar3) {
    iVar6 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x11])(this,key,actualReturn,status);
    pUVar10 = (UObject *)CONCAT44(extraout_var_01,iVar6);
  }
  return pUVar10;
LAB_0028cb0b:
  if (iVar6 < 1) goto LAB_0028ca61;
  iVar6 = iVar6 + -1;
  pUVar11 = (UnicodeString *)UVector::elementAt(local_b8,iVar6);
  Hashtable::put(this->serviceCache,pUVar11,local_b0,status);
  if (U_ZERO_ERROR < *status) goto LAB_0028cc1a;
  local_b0->refcount = local_b0->refcount + 1;
  UVector::removeElementAt(local_b8,iVar6);
  goto LAB_0028cb0b;
LAB_0028ca61:
  if (actualReturn != (UnicodeString *)0x0) {
    pUVar11 = &local_b0->actualDescriptor;
    iVar7 = UnicodeString::indexOf(pUVar11,L'/');
    if (iVar7 == 0) {
      uVar1 = (actualReturn->fUnion).fStackFields.fLengthAndFlags;
      uVar12 = 2;
      if ((uVar1 & 1) == 0) {
        uVar12 = uVar1 & 0x1e;
      }
      (actualReturn->fUnion).fStackFields.fLengthAndFlags = uVar12;
      sVar2 = (local_b0->actualDescriptor).fUnion.fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar6 = (local_b0->actualDescriptor).fUnion.fFields.fLength;
      }
      else {
        iVar6 = (int)sVar2 >> 5;
      }
      UnicodeString::doAppend(actualReturn,pUVar11,1,iVar6 + -1);
    }
    else {
      UnicodeString::operator=(actualReturn,pUVar11);
    }
    if ((undefined1  [56])((undefined1  [56])actualReturn->fUnion & (undefined1  [56])0x1) !=
        (undefined1  [56])0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      CacheEntry::~CacheEntry(local_b0);
      UMemory::operator_delete((UMemory *)local_b0,pUVar11);
LAB_0028cc18:
      pUVar10 = (UObject *)0x0;
      goto LAB_0028cc1a;
    }
  }
  p_00 = local_b0->service;
  iVar6 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xe])(this);
  pUVar10 = (UObject *)CONCAT44(extraout_var_00,iVar6);
  if (bVar4 && factory != (ICUServiceFactory *)0x0) {
    CacheEntry::~CacheEntry(local_b0);
    UMemory::operator_delete((UMemory *)local_b0,p_00);
  }
  goto LAB_0028cc1a;
}

Assistant:

UnicodeString& 
ICUService::getDisplayName(const UnicodeString& id, UnicodeString& result, const Locale& locale) const 
{
    {
        UErrorCode status = U_ZERO_ERROR;
        Mutex mutex(&lock);
        const Hashtable* map = getVisibleIDMap(status);
        if (map != NULL) {
            ICUServiceFactory* f = (ICUServiceFactory*)map->get(id);
            if (f != NULL) {
                f->getDisplayName(id, locale, result);
                return result;
            }

            // fallback
            status = U_ZERO_ERROR;
            ICUServiceKey* fallbackKey = createKey(&id, status);
            while (fallbackKey != NULL && fallbackKey->fallback()) {
                UnicodeString us;
                fallbackKey->currentID(us);
                f = (ICUServiceFactory*)map->get(us);
                if (f != NULL) {
                    f->getDisplayName(id, locale, result);
                    delete fallbackKey;
                    return result;
                }
            }
            delete fallbackKey;
        }
    }
    result.setToBogus();
    return result;
}